

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O0

int DispatchAlpha_SSE2(uint8_t *alpha,int alpha_stride,int width,int height,uint8_t *dst,
                      int dst_stride)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  byte bVar18;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  __m128i a2_lo_lo;
  __m128i a1_hi;
  __m128i a1_lo;
  __m128i a0;
  char *ptr;
  __m128i all_alphas8;
  __m128i all_alphas16;
  __m128i all_0xff;
  __m128i alpha_mask;
  __m128i zero;
  int j;
  int i;
  uint32_t alpha_and;
  bool local_4be;
  ulong local_3f8;
  ulong uStack_3f0;
  ulong local_3e8;
  ulong uStack_3e0;
  int local_3a8;
  int local_3a4;
  long local_398;
  long local_380;
  byte local_338;
  undefined1 uStack_337;
  byte bStack_336;
  undefined1 uStack_335;
  byte bStack_334;
  undefined1 uStack_333;
  byte bStack_332;
  undefined1 uStack_331;
  byte local_318;
  undefined1 uStack_317;
  byte bStack_316;
  undefined1 uStack_315;
  byte bStack_314;
  undefined1 uStack_313;
  byte bStack_312;
  undefined1 uStack_311;
  byte bStack_2e0;
  undefined1 uStack_2df;
  byte bStack_2de;
  undefined1 uStack_2dd;
  byte bStack_2dc;
  undefined1 uStack_2db;
  byte bStack_2da;
  undefined1 uStack_2d9;
  char cStack_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  uint32_t alpha_value;
  __m128i a2_hi;
  __m128i a2_lo;
  __m128i a1;
  __m128i a0_1;
  __m128i a2_hi_hi;
  __m128i a2_hi_lo;
  __m128i a2_lo_hi;
  
  bVar18 = 0xff;
  local_3f8 = 0xffffffffffffffff;
  uStack_3f0 = 0xffffffffffffffff;
  local_3e8 = local_3f8;
  uStack_3e0 = uStack_3f0;
  local_398 = in_R8;
  local_380 = in_RDI;
  for (local_3a8 = 0; local_3a8 < in_ECX; local_3a8 = local_3a8 + 1) {
    for (local_3a4 = 0; local_3a4 + 0x10 <= in_EDX + -1; local_3a4 = local_3a4 + 0x10) {
      uVar1 = *(ulong *)(local_380 + local_3a4);
      uVar3 = ((ulong *)(local_380 + local_3a4))[1];
      local_318 = (byte)uVar1;
      uStack_317 = (undefined1)(uVar1 >> 8);
      bStack_316 = (byte)(uVar1 >> 0x10);
      uStack_315 = (undefined1)(uVar1 >> 0x18);
      bStack_314 = (byte)(uVar1 >> 0x20);
      uStack_313 = (undefined1)(uVar1 >> 0x28);
      bStack_312 = (byte)(uVar1 >> 0x30);
      uStack_311 = (undefined1)(uVar1 >> 0x38);
      bStack_2e0 = (byte)uVar3;
      uStack_2df = (undefined1)(uVar3 >> 8);
      bStack_2de = (byte)(uVar3 >> 0x10);
      uStack_2dd = (undefined1)(uVar3 >> 0x18);
      bStack_2dc = (byte)(uVar3 >> 0x20);
      uStack_2db = (undefined1)(uVar3 >> 0x28);
      bStack_2da = (byte)(uVar3 >> 0x30);
      uStack_2d9 = (undefined1)(uVar3 >> 0x38);
      auVar15._6_2_ = 0;
      auVar15._0_6_ =
           (uint6)CONCAT14(uStack_317,(uint)CONCAT12(uStack_317,(ushort)local_318)) & 0xffff0000ffff
      ;
      auVar15._9_3_ = 0;
      auVar15[8] = bStack_316;
      auVar15[0xc] = uStack_315;
      auVar15._13_3_ = 0;
      auVar14._8_8_ = 0xff000000ff;
      auVar14._0_8_ = 0xff000000ff;
      maskmovdqu(auVar15,auVar14);
      auVar13._6_2_ = 0;
      auVar13._0_6_ =
           (uint6)CONCAT14(uStack_313,(uint)CONCAT12(uStack_313,(ushort)bStack_314)) &
           0xffff0000ffff;
      auVar13._9_3_ = 0;
      auVar13[8] = bStack_312;
      auVar13[0xc] = uStack_311;
      auVar13._13_3_ = 0;
      auVar12._8_8_ = 0xff000000ff;
      auVar12._0_8_ = 0xff000000ff;
      maskmovdqu(auVar13,auVar12);
      auVar11._6_2_ = 0;
      auVar11._0_6_ =
           (uint6)CONCAT14(uStack_2df,(uint)CONCAT12(uStack_2df,(ushort)bStack_2e0)) &
           0xffff0000ffff;
      auVar11._9_3_ = 0;
      auVar11[8] = bStack_2de;
      auVar11[0xc] = uStack_2dd;
      auVar11._13_3_ = 0;
      auVar10._8_8_ = 0xff000000ff;
      auVar10._0_8_ = 0xff000000ff;
      maskmovdqu(auVar11,auVar10);
      auVar9._6_2_ = 0;
      auVar9._0_6_ = (uint6)CONCAT14(uStack_2db,(uint)CONCAT12(uStack_2db,(ushort)bStack_2dc)) &
                     0xffff0000ffff;
      auVar9._9_3_ = 0;
      auVar9[8] = bStack_2da;
      auVar9[0xc] = uStack_2d9;
      auVar9._13_3_ = 0;
      auVar8._8_8_ = 0xff000000ff;
      auVar8._0_8_ = 0xff000000ff;
      maskmovdqu(auVar9,auVar8);
      local_3e8 = local_3e8 & uVar1;
      uStack_3e0 = uStack_3e0 & uVar3;
    }
    if (local_3a4 + 8 <= in_EDX + -1) {
      uVar1 = *(ulong *)(local_380 + local_3a4);
      local_338 = (byte)uVar1;
      uStack_337 = (undefined1)(uVar1 >> 8);
      bStack_336 = (byte)(uVar1 >> 0x10);
      uStack_335 = (undefined1)(uVar1 >> 0x18);
      bStack_334 = (byte)(uVar1 >> 0x20);
      uStack_333 = (undefined1)(uVar1 >> 0x28);
      bStack_332 = (byte)(uVar1 >> 0x30);
      uStack_331 = (undefined1)(uVar1 >> 0x38);
      auVar7._6_2_ = 0;
      auVar7._0_6_ = (uint6)CONCAT14(uStack_337,(uint)CONCAT12(uStack_337,(ushort)local_338)) &
                     0xffff0000ffff;
      auVar7._9_3_ = 0;
      auVar7[8] = bStack_336;
      auVar7[0xc] = uStack_335;
      auVar7._13_3_ = 0;
      auVar6._8_8_ = 0xff000000ff;
      auVar6._0_8_ = 0xff000000ff;
      maskmovdqu(auVar7,auVar6);
      auVar5._6_2_ = 0;
      auVar5._0_6_ = (uint6)CONCAT14(uStack_333,(uint)CONCAT12(uStack_333,(ushort)bStack_334)) &
                     0xffff0000ffff;
      auVar5._9_3_ = 0;
      auVar5[8] = bStack_332;
      auVar5[0xc] = uStack_331;
      auVar5._13_3_ = 0;
      auVar4._8_8_ = 0xff000000ff;
      auVar4._0_8_ = 0xff000000ff;
      maskmovdqu(auVar5,auVar4);
      local_3f8 = local_3f8 & uVar1;
      uStack_3f0 = 0;
      local_3a4 = local_3a4 + 8;
    }
    for (; local_3a4 < in_EDX; local_3a4 = local_3a4 + 1) {
      bVar2 = *(byte *)(local_380 + local_3a4);
      *(byte *)(local_398 + (local_3a4 << 2)) = bVar2;
      bVar18 = bVar2 & bVar18;
    }
    local_380 = local_380 + in_ESI;
    local_398 = local_398 + in_R9D;
  }
  a2_lo[1]._0_1_ = (char)local_3f8;
  a2_lo[1]._1_1_ = (char)(local_3f8 >> 8);
  a2_lo[1]._2_1_ = (char)(local_3f8 >> 0x10);
  a2_lo[1]._3_1_ = (char)(local_3f8 >> 0x18);
  a2_lo[1]._4_1_ = (char)(local_3f8 >> 0x20);
  a2_lo[1]._5_1_ = (char)(local_3f8 >> 0x28);
  a2_lo[1]._6_1_ = (char)(local_3f8 >> 0x30);
  a2_lo[1]._7_1_ = (char)(local_3f8 >> 0x38);
  a1[0]._0_1_ = (char)uStack_3f0;
  a1[0]._1_1_ = (char)(uStack_3f0 >> 8);
  a1[0]._2_1_ = (char)(uStack_3f0 >> 0x10);
  a1[0]._3_1_ = (char)(uStack_3f0 >> 0x18);
  a1[0]._4_1_ = (char)(uStack_3f0 >> 0x20);
  a1[0]._5_1_ = (char)(uStack_3f0 >> 0x28);
  a1[0]._6_1_ = (char)(uStack_3f0 >> 0x30);
  a1[0]._7_1_ = (char)(uStack_3f0 >> 0x38);
  auVar17[1] = -(a2_lo[1]._1_1_ == -1);
  auVar17[0] = -((char)a2_lo[1] == -1);
  auVar17[2] = -(a2_lo[1]._2_1_ == -1);
  auVar17[3] = -(a2_lo[1]._3_1_ == -1);
  auVar17[4] = -(a2_lo[1]._4_1_ == -1);
  auVar17[5] = -(a2_lo[1]._5_1_ == -1);
  auVar17[6] = -(a2_lo[1]._6_1_ == -1);
  auVar17[7] = -(a2_lo[1]._7_1_ == -1);
  auVar17[8] = -((char)a1[0] == -1);
  auVar17[9] = -(a1[0]._1_1_ == -1);
  auVar17[10] = -(a1[0]._2_1_ == -1);
  auVar17[0xb] = -(a1[0]._3_1_ == -1);
  auVar17[0xc] = -(a1[0]._4_1_ == -1);
  auVar17[0xd] = -(a1[0]._5_1_ == -1);
  auVar17[0xe] = -(a1[0]._6_1_ == -1);
  auVar17[0xf] = -(a1[0]._7_1_ == -1);
  local_4be = true;
  if (((SUB161(auVar17 >> 7,0) & 1 | (SUB161(auVar17 >> 0xf,0) & 1) << 1 |
        (SUB161(auVar17 >> 0x17,0) & 1) << 2 | (SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
        (SUB161(auVar17 >> 0x27,0) & 1) << 4 | (SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
        (SUB161(auVar17 >> 0x37,0) & 1) << 6 | SUB161(auVar17 >> 0x3f,0) << 7) & bVar18) == 0xff) {
    cStack_78 = (char)local_3e8;
    cStack_77 = (char)(local_3e8 >> 8);
    cStack_76 = (char)(local_3e8 >> 0x10);
    cStack_75 = (char)(local_3e8 >> 0x18);
    alpha_value._0_1_ = (char)(local_3e8 >> 0x20);
    alpha_value._1_1_ = (char)(local_3e8 >> 0x28);
    alpha_value._2_1_ = (char)(local_3e8 >> 0x30);
    alpha_value._3_1_ = (char)(local_3e8 >> 0x38);
    a2_hi[0]._0_1_ = (char)uStack_3e0;
    a2_hi[0]._1_1_ = (char)(uStack_3e0 >> 8);
    a2_hi[0]._2_1_ = (char)(uStack_3e0 >> 0x10);
    a2_hi[0]._3_1_ = (char)(uStack_3e0 >> 0x18);
    a2_hi[0]._4_1_ = (char)(uStack_3e0 >> 0x20);
    a2_hi[0]._5_1_ = (char)(uStack_3e0 >> 0x28);
    a2_hi[0]._6_1_ = (char)(uStack_3e0 >> 0x30);
    a2_hi[0]._7_1_ = (char)(uStack_3e0 >> 0x38);
    auVar16[1] = -(cStack_77 == -1);
    auVar16[0] = -(cStack_78 == -1);
    auVar16[2] = -(cStack_76 == -1);
    auVar16[3] = -(cStack_75 == -1);
    auVar16[4] = -((char)alpha_value == -1);
    auVar16[5] = -(alpha_value._1_1_ == -1);
    auVar16[6] = -(alpha_value._2_1_ == -1);
    auVar16[7] = -(alpha_value._3_1_ == -1);
    auVar16[8] = -((char)a2_hi[0] == -1);
    auVar16[9] = -(a2_hi[0]._1_1_ == -1);
    auVar16[10] = -(a2_hi[0]._2_1_ == -1);
    auVar16[0xb] = -(a2_hi[0]._3_1_ == -1);
    auVar16[0xc] = -(a2_hi[0]._4_1_ == -1);
    auVar16[0xd] = -(a2_hi[0]._5_1_ == -1);
    auVar16[0xe] = -(a2_hi[0]._6_1_ == -1);
    auVar16[0xf] = -(a2_hi[0]._7_1_ == -1);
    local_4be = (ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                        (ushort)((byte)-(a2_hi[0]._7_1_ == -1) >> 7) << 0xf) != 0xffff;
  }
  return (int)local_4be;
}

Assistant:

static int DispatchAlpha_SSE2(const uint8_t* WEBP_RESTRICT alpha,
                              int alpha_stride, int width, int height,
                              uint8_t* WEBP_RESTRICT dst, int dst_stride) {
  // alpha_and stores an 'and' operation of all the alpha[] values. The final
  // value is not 0xff if any of the alpha[] is not equal to 0xff.
  uint32_t alpha_and = 0xff;
  int i, j;
  const __m128i zero = _mm_setzero_si128();
  const __m128i alpha_mask = _mm_set1_epi32((int)0xff);  // to preserve A
  const __m128i all_0xff = _mm_set1_epi8((char)0xff);
  __m128i all_alphas16 = all_0xff;
  __m128i all_alphas8 = all_0xff;

  // We must be able to access 3 extra bytes after the last written byte
  // 'dst[4 * width - 4]', because we don't know if alpha is the first or the
  // last byte of the quadruplet.
  for (j = 0; j < height; ++j) {
    char* ptr = (char*)dst;
    for (i = 0; i + 16 <= width - 1; i += 16) {
      // load 16 alpha bytes
      const __m128i a0 = _mm_loadu_si128((const __m128i*)&alpha[i]);
      const __m128i a1_lo = _mm_unpacklo_epi8(a0, zero);
      const __m128i a1_hi = _mm_unpackhi_epi8(a0, zero);
      const __m128i a2_lo_lo = _mm_unpacklo_epi16(a1_lo, zero);
      const __m128i a2_lo_hi = _mm_unpackhi_epi16(a1_lo, zero);
      const __m128i a2_hi_lo = _mm_unpacklo_epi16(a1_hi, zero);
      const __m128i a2_hi_hi = _mm_unpackhi_epi16(a1_hi, zero);
      _mm_maskmoveu_si128(a2_lo_lo, alpha_mask, ptr + 0);
      _mm_maskmoveu_si128(a2_lo_hi, alpha_mask, ptr + 16);
      _mm_maskmoveu_si128(a2_hi_lo, alpha_mask, ptr + 32);
      _mm_maskmoveu_si128(a2_hi_hi, alpha_mask, ptr + 48);
      // accumulate 16 alpha 'and' in parallel
      all_alphas16 = _mm_and_si128(all_alphas16, a0);
      ptr += 64;
    }
    if (i + 8 <= width - 1) {
      // load 8 alpha bytes
      const __m128i a0 = _mm_loadl_epi64((const __m128i*)&alpha[i]);
      const __m128i a1 = _mm_unpacklo_epi8(a0, zero);
      const __m128i a2_lo = _mm_unpacklo_epi16(a1, zero);
      const __m128i a2_hi = _mm_unpackhi_epi16(a1, zero);
      _mm_maskmoveu_si128(a2_lo, alpha_mask, ptr);
      _mm_maskmoveu_si128(a2_hi, alpha_mask, ptr + 16);
      // accumulate 8 alpha 'and' in parallel
      all_alphas8 = _mm_and_si128(all_alphas8, a0);
      i += 8;
    }
    for (; i < width; ++i) {
      const uint32_t alpha_value = alpha[i];
      dst[4 * i] = alpha_value;
      alpha_and &= alpha_value;
    }
    alpha += alpha_stride;
    dst += dst_stride;
  }
  // Combine the eight alpha 'and' into a 8-bit mask.
  alpha_and &= _mm_movemask_epi8(_mm_cmpeq_epi8(all_alphas8, all_0xff)) & 0xff;
  return (alpha_and != 0xff ||
          _mm_movemask_epi8(_mm_cmpeq_epi8(all_alphas16, all_0xff)) != 0xffff);
}